

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O3

void lc_error(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  char buf [512];
  undefined8 local_2d8;
  void **local_2d0;
  undefined1 *local_2c8;
  undefined1 local_2b8 [8];
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  undefined8 local_218;
  char local_208 [512];
  
  local_2c8 = local_2b8;
  if (in_AL != '\0') {
    local_288 = in_XMM0_Qa;
    local_278 = in_XMM1_Qa;
    local_268 = in_XMM2_Qa;
    local_258 = in_XMM3_Qa;
    local_248 = in_XMM4_Qa;
    local_238 = in_XMM5_Qa;
    local_228 = in_XMM6_Qa;
    local_218 = in_XMM7_Qa;
  }
  local_2d0 = &argp[0].overflow_arg_area;
  local_2d8 = 0x3000000008;
  local_2b0 = in_RSI;
  local_2a8 = in_RDX;
  local_2a0 = in_RCX;
  local_298 = in_R8;
  local_290 = in_R9;
  vsnprintf(local_208,0x1ff,fmt,&local_2d8);
  yyerror(local_208);
  return;
}

Assistant:

void lc_error(const char *fmt, ...)
{
	char buf[512];
	va_list argp;

	va_start(argp, fmt);
	vsnprintf(buf, 511, fmt, argp);
	va_end(argp);

	yyerror(buf);
}